

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaParseNewDoc
              (xmlSchemaParserCtxtPtr pctxt,xmlSchemaPtr schema,xmlSchemaBucketPtr_conflict bucket)

{
  xmlSchemaParserCtxtPtr ctxt;
  int res;
  xmlSchemaParserCtxtPtr newpctxt;
  xmlSchemaBucketPtr_conflict bucket_local;
  xmlSchemaPtr schema_local;
  xmlSchemaParserCtxtPtr pctxt_local;
  
  if (bucket == (xmlSchemaBucketPtr_conflict)0x0) {
    pctxt_local._4_4_ = 0;
  }
  else if (bucket->parsed == 0) {
    if (bucket->doc == (xmlDocPtr)0x0) {
      xmlSchemaInternalErr
                ((xmlSchemaAbstractCtxtPtr)pctxt,"xmlSchemaParseNewDoc",
                 "parsing a schema doc, but there\'s no doc");
      pctxt_local._4_4_ = -1;
    }
    else if (pctxt->constructor == (xmlSchemaConstructionCtxtPtr)0x0) {
      xmlSchemaInternalErr((xmlSchemaAbstractCtxtPtr)pctxt,"xmlSchemaParseNewDoc","no constructor");
      pctxt_local._4_4_ = -1;
    }
    else {
      ctxt = xmlSchemaNewParserCtxtUseDict((char *)bucket->schemaLocation,pctxt->dict);
      if (ctxt == (xmlSchemaParserCtxtPtr)0x0) {
        pctxt_local._4_4_ = -1;
      }
      else {
        ctxt->constructor = pctxt->constructor;
        ctxt->schema = schema;
        xmlSchemaSetParserErrors(ctxt,pctxt->error,pctxt->warning,pctxt->errCtxt);
        xmlSchemaSetParserStructuredErrors(ctxt,pctxt->serror,pctxt->errCtxt);
        ctxt->counter = pctxt->counter;
        pctxt_local._4_4_ = xmlSchemaParseNewDocWithContext(ctxt,schema,bucket);
        if (pctxt_local._4_4_ != 0) {
          pctxt->err = pctxt_local._4_4_;
        }
        pctxt->nberrors = ctxt->nberrors + pctxt->nberrors;
        pctxt->counter = ctxt->counter;
        ctxt->constructor = (xmlSchemaConstructionCtxtPtr)0x0;
        xmlSchemaFreeParserCtxt(ctxt);
      }
    }
  }
  else {
    xmlSchemaInternalErr
              ((xmlSchemaAbstractCtxtPtr)pctxt,"xmlSchemaParseNewDoc","reparsing a schema doc");
    pctxt_local._4_4_ = -1;
  }
  return pctxt_local._4_4_;
}

Assistant:

static int
xmlSchemaParseNewDoc(xmlSchemaParserCtxtPtr pctxt,
		     xmlSchemaPtr schema,
		     xmlSchemaBucketPtr bucket)
{
    xmlSchemaParserCtxtPtr newpctxt;
    int res = 0;

    if (bucket == NULL)
	return(0);
    if (bucket->parsed) {
	PERROR_INT("xmlSchemaParseNewDoc",
	    "reparsing a schema doc");
	return(-1);
    }
    if (bucket->doc == NULL) {
	PERROR_INT("xmlSchemaParseNewDoc",
	    "parsing a schema doc, but there's no doc");
	return(-1);
    }
    if (pctxt->constructor == NULL) {
	PERROR_INT("xmlSchemaParseNewDoc",
	    "no constructor");
	return(-1);
    }
    /* Create and init the temporary parser context. */
    newpctxt = xmlSchemaNewParserCtxtUseDict(
	(const char *) bucket->schemaLocation, pctxt->dict);
    if (newpctxt == NULL)
	return(-1);
    newpctxt->constructor = pctxt->constructor;
    /*
    * TODO: Can we avoid that the parser knows about the main schema?
    * It would be better if he knows about the current schema bucket
    * only.
    */
    newpctxt->schema = schema;
    xmlSchemaSetParserErrors(newpctxt, pctxt->error, pctxt->warning,
	pctxt->errCtxt);
    xmlSchemaSetParserStructuredErrors(newpctxt, pctxt->serror,
	pctxt->errCtxt);
    newpctxt->counter = pctxt->counter;


    res = xmlSchemaParseNewDocWithContext(newpctxt, schema, bucket);

    /* Channel back errors and cleanup the temporary parser context. */
    if (res != 0)
	pctxt->err = res;
    pctxt->nberrors += newpctxt->nberrors;
    pctxt->counter = newpctxt->counter;
    newpctxt->constructor = NULL;
    /* Free the parser context. */
    xmlSchemaFreeParserCtxt(newpctxt);
    return(res);
}